

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O3

vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *
puppup::movegen::genFromBoard
          (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
           *__return_storage_ptr__,Gaddag *gaddag,bool param_3)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  long lVar3;
  long lVar4;
  ulong uVar5;
  idx i;
  long lVar6;
  undefined1 *puVar7;
  long step;
  undefined8 *puVar8;
  char *pcVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  long r;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  undefined1 in_stack_00000048 [64];
  undefined1 in_stack_00000088 [64];
  undefined1 in_stack_000000c8 [64];
  array<long,_16384UL> orthogonal_memo;
  long lStack_22288;
  long lStack_22280;
  undefined1 auStack_22278 [16];
  pointer pMStack_22268;
  undefined1 *puStack_22258;
  undefined8 uStack_22250;
  char acStack_22248 [256];
  undefined1 auStack_22148 [128];
  undefined1 auStack_220c8 [64];
  undefined1 auStack_22088 [64];
  undefined8 auStack_22040 [257];
  undefined1 auStack_21838 [2048];
  State SStack_21038;
  array<long,_16384UL> aStack_20030;
  
  pauVar2 = (undefined1 (*) [16])acStack_22248;
  lVar6 = 0;
  acStack_22248[0xc0] = '\0';
  acStack_22248[0xc1] = '\0';
  acStack_22248[0xc2] = '\0';
  acStack_22248[0xc3] = '\0';
  acStack_22248[0xc4] = '\0';
  acStack_22248[0xc5] = '\0';
  acStack_22248[0xc6] = '\0';
  acStack_22248[199] = '\0';
  acStack_22248[200] = '\0';
  acStack_22248[0xc9] = '\0';
  acStack_22248[0xca] = '\0';
  acStack_22248[0xcb] = '\0';
  acStack_22248[0xcc] = '\0';
  acStack_22248[0xcd] = '\0';
  acStack_22248[0xce] = '\0';
  acStack_22248[0xcf] = '\0';
  acStack_22248[0xd0] = '\0';
  acStack_22248[0xd1] = '\0';
  acStack_22248[0xd2] = '\0';
  acStack_22248[0xd3] = '\0';
  acStack_22248[0xd4] = '\0';
  acStack_22248[0xd5] = '\0';
  acStack_22248[0xd6] = '\0';
  acStack_22248[0xd7] = '\0';
  acStack_22248[0xd8] = '\0';
  acStack_22248[0xd9] = '\0';
  acStack_22248[0xda] = '\0';
  acStack_22248[0xdb] = '\0';
  acStack_22248[0xdc] = '\0';
  acStack_22248[0xdd] = '\0';
  acStack_22248[0xde] = '\0';
  acStack_22248[0xdf] = '\0';
  acStack_22248[0xe0] = '\0';
  acStack_22248[0xe1] = '\0';
  acStack_22248[0xe2] = '\0';
  acStack_22248[0xe3] = '\0';
  acStack_22248[0xe4] = '\0';
  acStack_22248[0xe5] = '\0';
  acStack_22248[0xe6] = '\0';
  acStack_22248[0xe7] = '\0';
  acStack_22248[0xe8] = '\0';
  acStack_22248[0xe9] = '\0';
  acStack_22248[0xea] = '\0';
  acStack_22248[0xeb] = '\0';
  acStack_22248[0xec] = '\0';
  acStack_22248[0xed] = '\0';
  acStack_22248[0xee] = '\0';
  acStack_22248[0xef] = '\0';
  acStack_22248[0xf0] = '\0';
  acStack_22248[0xf1] = '\0';
  acStack_22248[0xf2] = '\0';
  acStack_22248[0xf3] = '\0';
  acStack_22248[0xf4] = '\0';
  acStack_22248[0xf5] = '\0';
  acStack_22248[0xf6] = '\0';
  acStack_22248[0xf7] = '\0';
  acStack_22248[0xf8] = '\0';
  acStack_22248[0xf9] = '\0';
  acStack_22248[0xfa] = '\0';
  acStack_22248[0xfb] = '\0';
  acStack_22248[0xfc] = '\0';
  acStack_22248[0xfd] = '\0';
  acStack_22248[0xfe] = '\0';
  acStack_22248[0xff] = '\0';
  acStack_22248[0x80] = '\0';
  acStack_22248[0x81] = '\0';
  acStack_22248[0x82] = '\0';
  acStack_22248[0x83] = '\0';
  acStack_22248[0x84] = '\0';
  acStack_22248[0x85] = '\0';
  acStack_22248[0x86] = '\0';
  acStack_22248[0x87] = '\0';
  acStack_22248[0x88] = '\0';
  acStack_22248[0x89] = '\0';
  acStack_22248[0x8a] = '\0';
  acStack_22248[0x8b] = '\0';
  acStack_22248[0x8c] = '\0';
  acStack_22248[0x8d] = '\0';
  acStack_22248[0x8e] = '\0';
  acStack_22248[0x8f] = '\0';
  acStack_22248[0x90] = '\0';
  acStack_22248[0x91] = '\0';
  acStack_22248[0x92] = '\0';
  acStack_22248[0x93] = '\0';
  acStack_22248[0x94] = '\0';
  acStack_22248[0x95] = '\0';
  acStack_22248[0x96] = '\0';
  acStack_22248[0x97] = '\0';
  acStack_22248[0x98] = '\0';
  acStack_22248[0x99] = '\0';
  acStack_22248[0x9a] = '\0';
  acStack_22248[0x9b] = '\0';
  acStack_22248[0x9c] = '\0';
  acStack_22248[0x9d] = '\0';
  acStack_22248[0x9e] = '\0';
  acStack_22248[0x9f] = '\0';
  acStack_22248[0xa0] = '\0';
  acStack_22248[0xa1] = '\0';
  acStack_22248[0xa2] = '\0';
  acStack_22248[0xa3] = '\0';
  acStack_22248[0xa4] = '\0';
  acStack_22248[0xa5] = '\0';
  acStack_22248[0xa6] = '\0';
  acStack_22248[0xa7] = '\0';
  acStack_22248[0xa8] = '\0';
  acStack_22248[0xa9] = '\0';
  acStack_22248[0xaa] = '\0';
  acStack_22248[0xab] = '\0';
  acStack_22248[0xac] = '\0';
  acStack_22248[0xad] = '\0';
  acStack_22248[0xae] = '\0';
  acStack_22248[0xaf] = '\0';
  acStack_22248[0xb0] = '\0';
  acStack_22248[0xb1] = '\0';
  acStack_22248[0xb2] = '\0';
  acStack_22248[0xb3] = '\0';
  acStack_22248[0xb4] = '\0';
  acStack_22248[0xb5] = '\0';
  acStack_22248[0xb6] = '\0';
  acStack_22248[0xb7] = '\0';
  acStack_22248[0xb8] = '\0';
  acStack_22248[0xb9] = '\0';
  acStack_22248[0xba] = '\0';
  acStack_22248[0xbb] = '\0';
  acStack_22248[0xbc] = '\0';
  acStack_22248[0xbd] = '\0';
  acStack_22248[0xbe] = '\0';
  acStack_22248[0xbf] = '\0';
  acStack_22248[0x40] = '\0';
  acStack_22248[0x41] = '\0';
  acStack_22248[0x42] = '\0';
  acStack_22248[0x43] = '\0';
  acStack_22248[0x44] = '\0';
  acStack_22248[0x45] = '\0';
  acStack_22248[0x46] = '\0';
  acStack_22248[0x47] = '\0';
  acStack_22248[0x48] = '\0';
  acStack_22248[0x49] = '\0';
  acStack_22248[0x4a] = '\0';
  acStack_22248[0x4b] = '\0';
  acStack_22248[0x4c] = '\0';
  acStack_22248[0x4d] = '\0';
  acStack_22248[0x4e] = '\0';
  acStack_22248[0x4f] = '\0';
  acStack_22248[0x50] = '\0';
  acStack_22248[0x51] = '\0';
  acStack_22248[0x52] = '\0';
  acStack_22248[0x53] = '\0';
  acStack_22248[0x54] = '\0';
  acStack_22248[0x55] = '\0';
  acStack_22248[0x56] = '\0';
  acStack_22248[0x57] = '\0';
  acStack_22248[0x58] = '\0';
  acStack_22248[0x59] = '\0';
  acStack_22248[0x5a] = '\0';
  acStack_22248[0x5b] = '\0';
  acStack_22248[0x5c] = '\0';
  acStack_22248[0x5d] = '\0';
  acStack_22248[0x5e] = '\0';
  acStack_22248[0x5f] = '\0';
  acStack_22248[0x60] = '\0';
  acStack_22248[0x61] = '\0';
  acStack_22248[0x62] = '\0';
  acStack_22248[99] = '\0';
  acStack_22248[100] = '\0';
  acStack_22248[0x65] = '\0';
  acStack_22248[0x66] = '\0';
  acStack_22248[0x67] = '\0';
  acStack_22248[0x68] = '\0';
  acStack_22248[0x69] = '\0';
  acStack_22248[0x6a] = '\0';
  acStack_22248[0x6b] = '\0';
  acStack_22248[0x6c] = '\0';
  acStack_22248[0x6d] = '\0';
  acStack_22248[0x6e] = '\0';
  acStack_22248[0x6f] = '\0';
  acStack_22248[0x70] = '\0';
  acStack_22248[0x71] = '\0';
  acStack_22248[0x72] = '\0';
  acStack_22248[0x73] = '\0';
  acStack_22248[0x74] = '\0';
  acStack_22248[0x75] = '\0';
  acStack_22248[0x76] = '\0';
  acStack_22248[0x77] = '\0';
  acStack_22248[0x78] = '\0';
  acStack_22248[0x79] = '\0';
  acStack_22248[0x7a] = '\0';
  acStack_22248[0x7b] = '\0';
  acStack_22248[0x7c] = '\0';
  acStack_22248[0x7d] = '\0';
  acStack_22248[0x7e] = '\0';
  acStack_22248[0x7f] = '\0';
  acStack_22248[0] = '\0';
  acStack_22248[1] = '\0';
  acStack_22248[2] = '\0';
  acStack_22248[3] = '\0';
  acStack_22248[4] = '\0';
  acStack_22248[5] = '\0';
  acStack_22248[6] = '\0';
  acStack_22248[7] = '\0';
  acStack_22248[8] = '\0';
  acStack_22248[9] = '\0';
  acStack_22248[10] = '\0';
  acStack_22248[0xb] = '\0';
  acStack_22248[0xc] = '\0';
  acStack_22248[0xd] = '\0';
  acStack_22248[0xe] = '\0';
  acStack_22248[0xf] = '\0';
  acStack_22248[0x10] = '\0';
  acStack_22248[0x11] = '\0';
  acStack_22248[0x12] = '\0';
  acStack_22248[0x13] = '\0';
  acStack_22248[0x14] = '\0';
  acStack_22248[0x15] = '\0';
  acStack_22248[0x16] = '\0';
  acStack_22248[0x17] = '\0';
  acStack_22248[0x18] = '\0';
  acStack_22248[0x19] = '\0';
  acStack_22248[0x1a] = '\0';
  acStack_22248[0x1b] = '\0';
  acStack_22248[0x1c] = '\0';
  acStack_22248[0x1d] = '\0';
  acStack_22248[0x1e] = '\0';
  acStack_22248[0x1f] = '\0';
  acStack_22248[0x20] = '\0';
  acStack_22248[0x21] = '\0';
  acStack_22248[0x22] = '\0';
  acStack_22248[0x23] = '\0';
  acStack_22248[0x24] = '\0';
  acStack_22248[0x25] = '\0';
  acStack_22248[0x26] = '\0';
  acStack_22248[0x27] = '\0';
  acStack_22248[0x28] = '\0';
  acStack_22248[0x29] = '\0';
  acStack_22248[0x2a] = '\0';
  acStack_22248[0x2b] = '\0';
  acStack_22248[0x2c] = '\0';
  acStack_22248[0x2d] = '\0';
  acStack_22248[0x2e] = '\0';
  acStack_22248[0x2f] = '\0';
  acStack_22248[0x30] = '\0';
  acStack_22248[0x31] = '\0';
  acStack_22248[0x32] = '\0';
  acStack_22248[0x33] = '\0';
  acStack_22248[0x34] = '\0';
  acStack_22248[0x35] = '\0';
  acStack_22248[0x36] = '\0';
  acStack_22248[0x37] = '\0';
  acStack_22248[0x38] = '\0';
  acStack_22248[0x39] = '\0';
  acStack_22248[0x3a] = '\0';
  acStack_22248[0x3b] = '\0';
  acStack_22248[0x3c] = '\0';
  acStack_22248[0x3d] = '\0';
  acStack_22248[0x3e] = '\0';
  acStack_22248[0x3f] = '\0';
  do {
    if (*(long *)(&stack0x00000110 + lVar6 * 8) != 0x1b) {
      pauVar2[-1][lVar6] = 1;
      pauVar2[1][lVar6] = 1;
      pauVar2[-1][lVar6 + 0xf] = 1;
      acStack_22248[lVar6 + 1] = '\x01';
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xf0);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar11 = vpbroadcastq_avx512f(ZEXT816(0x1b));
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0xf));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
  lVar6 = 0;
  do {
    auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&board::word_multiplier + lVar6));
    vpcmpq_avx512f(auVar11,*(undefined1 (*) [64])(&stack0x00000110 + lVar6),4);
    auVar15 = vpandq_avx512f(auVar10,auVar12);
    auVar10 = vpaddq_avx512f(auVar10,auVar13);
    lVar6 = lVar6 + 0x40;
    vpcmpeqq_avx512f(auVar15,auVar12);
    vptestnmq_avx512f(auVar14,auVar14);
    auVar1 = vmovdqu8_avx512vl((undefined1  [16])0x0);
    *pauVar2 = auVar1;
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + 8);
  } while (lVar6 != 0x780);
  lStack_22288 = 0;
  auStack_22278 = (undefined1  [16])0x0;
  pMStack_22268 = (pointer)0x0;
  SStack_21038.score = 0x1000000001;
  puStack_22258 = &stack0x00000110;
  lVar6 = 0;
  do {
    auVar10 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffffe));
    lVar3 = (long)*(int *)((long)SStack_21038.board._M_elems + lVar6 + -8);
    lVar4 = 0;
    do {
      auVar11 = vmovdqu64_avx512f(auVar10);
      *(undefined1 (*) [64])(aStack_20030._M_elems + lVar4) = auVar11;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x4000);
    lVar4 = 0;
    pcVar9 = acStack_22248 + -lVar3;
    lStack_22280 = lVar3 * -2;
    puVar8 = &board::word_multiplier + -lVar3;
    puVar7 = puStack_22258 + lVar3 * -8;
    uStack_22250 = lVar6;
    do {
      if (acStack_22248[lVar4] == '\x01') {
        uVar5 = lVar4 - lVar3;
        if (acStack_22248[uVar5] == '\0') {
          if (uVar5 < 0xf1 && (uVar5 & 0x800000000000000f) != 0xf) {
            lVar6 = 0;
            while ((puVar8[lVar6] != 0 && (*(long *)(puVar7 + lVar6 * 8) != 0x1b))) {
              if (pcVar9[lVar6] != '\0') goto LAB_00109420;
              uVar5 = lStack_22280 + lVar6;
              if ((0xf0 < uVar5) || (lVar6 = lVar6 - lVar3, (uVar5 & 0x800000000000000f) == 0xf))
              break;
            }
          }
          lVar6 = 0;
          step = -lVar3;
        }
        else {
LAB_00109420:
          lVar6 = (((gaddag->nodes_).
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
          step = lVar3;
        }
        __impl::gen((Rack *)&stack0x00000008,step,lVar4,lVar4,lVar6,gaddag,(State *)&stack0x00000108
                    ,0,0,1,(vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                           auStack_22278,param_3,&aStack_20030,0,0);
        lStack_22288 = lStack_22288 + 1;
      }
      lStack_22280 = lStack_22280 + 1;
      lVar4 = lVar4 + 1;
      puVar8 = puVar8 + 1;
      puVar7 = puVar7 + 8;
      pcVar9 = pcVar9 + 1;
    } while (lVar4 != 0xf0);
    lVar6 = uStack_22250 + 4;
    if (lVar6 == 8) {
      if (lStack_22288 == 0) {
        auVar10 = vbroadcastsd_avx512f(ZEXT816(0x1b));
        lVar6 = 1;
        auStack_22040[0] = 0;
        do {
          *(undefined1 (*) [64])(auStack_22040 + lVar6) = auVar10;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x101);
        lVar6 = 0;
        memset(auStack_21838,0,0x800);
        memcpy(&SStack_21038,auStack_22040,0x1008);
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        auVar10 = vmovdqu64_avx512f(in_stack_00000048);
        auVar11 = vmovdqu64_avx512f(in_stack_00000088);
        auVar12 = vmovdqu64_avx512f(in_stack_000000c8);
        auStack_22148._0_8_ = r;
        auStack_22148._8_8_ = in_stack_00000010;
        auStack_22148._16_8_ = in_stack_00000018;
        auStack_22148._24_8_ = in_stack_00000020;
        auStack_22148._32_8_ = in_stack_00000028;
        auStack_22148._40_8_ = in_stack_00000030;
        auStack_22148._48_8_ = in_stack_00000038;
        auStack_22148._56_8_ = in_stack_00000040;
        auStack_22148._64_64_ = vmovdqu64_avx512f(auVar10);
        auStack_220c8 = vmovdqu64_avx512f(auVar11);
        auStack_22088 = vmovdqu64_avx512f(auVar12);
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auVar10 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffffe));
        do {
          auVar11 = vmovdqu64_avx512f(auVar10);
          *(undefined1 (*) [64])(aStack_20030._M_elems + lVar6) = auVar11;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x4000);
        __impl::gen((Rack *)auStack_22148,-1,0x77,0x77,0,gaddag,&SStack_21038,0,0,1,
                    __return_storage_ptr__,false,&aStack_20030,0,0);
        if ((pointer)auStack_22278._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_22278._0_8_,(long)pMStack_22268 - auStack_22278._0_8_);
        }
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)auStack_22278._0_8_;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)auStack_22278._8_8_;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = pMStack_22268;
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline std::vector<Move> genFromBoard(Rack r, const trie::Gaddag& gaddag,
                                      board::State state,
                                      const bool best_only = false) {
    std::array<bool, 256> buildable;
    buildable.fill(false);
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness) {
            buildable[i - 16] = true;
            buildable[i + 16] = true;
            buildable[i - 1] = true;
            buildable[i + 1] = true;
        }
    }
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness || __impl::edge(i)) {
            buildable[i] = false;
        }
    }

    std::vector<Move> outputs;
    idx n_buildable = 0;
    for (idx step : {1, 16}) {
        auto orthogonal_memo = constArray<256 * 32 * 2>(-2);
        for (idx i = 0; i < 240; ++i) {
            if (buildable[i]) {
                bool needs_both_directions = false;
                // todo: faster method than this ridiculous O(n^3) one
                if (!buildable[i - step]) {
                    needs_both_directions = true;
                    idx j = i - step;
                    while (!__impl::edge(j) && state.board[j] != emptiness) {
                        if (buildable[j]) {
                            needs_both_directions = false;
                            break;
                        }
                        j -= step;
                    }
                }
                // if (step == 1) std::cerr << "left ";
                // if (step == 16) std::cerr << "down ";
                if (needs_both_directions) {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " with both directions" << std::endl;
                    __impl::gen(r, -step, i, i, 0, gaddag, state, 0, 0, 1,
                                outputs, best_only, orthogonal_memo);
                } else {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " in forward directions" << std::endl;
                    __impl::gen(r, step, i, i, gaddag.get(0, trie::rev_marker),
                                gaddag, state, 0, 0, 1, outputs, best_only,
                                orthogonal_memo);
                }
                ++n_buildable;
            }
        }
    }
    if (!n_buildable) {
        return genFromIdx(r, gaddag);
    }
    // std::cerr << "outputs: " << outputs.size() << std::endl;
    return outputs;
}